

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O0

TBlockStorageClass __thiscall
glslang::TIntermediate::getBlockStorageOverride(TIntermediate *this,char *nameStr)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass>,_true>
  local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass>,_true>
  local_50;
  const_iterator pos;
  undefined1 local_40 [8];
  string name;
  char *nameStr_local;
  TIntermediate *this_local;
  
  name.field_2._8_8_ = nameStr;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,nameStr,
             (allocator<char> *)
             ((long)&pos.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass>,_true>
                     ._M_cur + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pos.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass>,_true>
                     ._M_cur + 7));
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass>_>_>
       ::find(&this->blockBackingOverrides,(key_type *)local_40);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass>_>_>
       ::end(&this->blockBackingOverrides);
  bVar1 = std::__detail::operator==(&local_50,&local_58);
  if (bVar1) {
    this_local._4_4_ = EbsNone;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass>,_false,_true>
                           *)&local_50);
    this_local._4_4_ = pvVar2->second;
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._4_4_;
}

Assistant:

TBlockStorageClass getBlockStorageOverride(const char* nameStr) const
    {
        std::string name = nameStr;
        auto pos = blockBackingOverrides.find(name);
        if (pos == blockBackingOverrides.end())
            return EbsNone;
        else
            return pos->second;
    }